

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O1

int ImpactGenerator::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x100);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Instance","",0.0,3.0,0.0,1.0,1.0,0,
                    "Determines the instance from which impacts are received via ImpactGenerator_AddImpact"
                   );
  RegisterParameter(definition,"Gain","dB",-120.0,50.0,0.0,1.0,1.0,1,"Overall gain");
  RegisterParameter(definition,"Threshold","dB",-120.0,0.0,-60.0,1.0,1.0,2,
                    "Threshold after which impacts stop playing");
  RegisterParameter(definition,"MaxImpacts","",1.0,1000.0,200.0,1.0,1.0,3,
                    "Maximum number of impact sounds played simultaneously on this instance");
  return 4;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Instance", "", 0.0f, MAXINSTANCES - 1, 0.0f, 1.0f, 1.0f, P_INSTANCE, "Determines the instance from which impacts are received via ImpactGenerator_AddImpact");
        RegisterParameter(definition, "Gain", "dB", -120.0f, 50.0f, 0.0f, 1.0f, 1.0f, P_GAIN, "Overall gain");
        RegisterParameter(definition, "Threshold", "dB", -120.0f, 0.0f, -60.0f, 1.0f, 1.0f, P_THR, "Threshold after which impacts stop playing");
        RegisterParameter(definition, "MaxImpacts", "", 1.0f, MAXIMPACTS, 200.0f, 1.0f, 1.0f, P_MAXIMPACTS, "Maximum number of impact sounds played simultaneously on this instance");
        return numparams;
    }